

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_31::WebSocketImpl::queuePong(WebSocketImpl *this,Array<unsigned_char> *payload)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  Array<unsigned_char> *this_01;
  Own<kj::_::PromiseNode> local_98;
  undefined1 local_88 [16];
  AsyncIoStream *pAStack_78;
  Maybe<kj::EntropySource_&> local_70;
  Own<kj::_::PromiseNode> intermediate;
  Array<unsigned_char> local_58;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  if (this->currentlySending == true) {
    _::NullableValue<kj::Array<unsigned_char>>::emplace<kj::Array<unsigned_char>>
              ((NullableValue<kj::Array<unsigned_char>> *)&this->queuedPong,payload);
    return;
  }
  if ((this->sendingPong).ptr.isSet == true) {
    this_01 = (Array<unsigned_char> *)(local_88 + 8);
    local_88._8_8_ = payload->ptr;
    pAStack_78 = (AsyncIoStream *)payload->size_;
    local_70.ptr = (EntropySource *)payload->disposer;
    payload->ptr = (uchar *)0x0;
    payload->size_ = 0;
    local_88._0_8_ = this;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&(this->sendingPong).ptr.field_1.value,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2467:58),_kj::Array<unsigned_char>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428910;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_88._0_8_;
    this_00[1].dependency.disposer = (Disposer *)local_88._8_8_;
    this_00[1].dependency.ptr = (PromiseNode *)pAStack_78;
    this_00[1].continuationTracePtr = local_70.ptr;
    local_88._8_8_ = (Disposer *)0x0;
    pAStack_78 = (AsyncIoStream *)0x0;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::queuePong(kj::Array<unsigned_char>)::{lambda(kj::Array<unsigned_char>)#1},kj::Array<unsigned_char>>,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    _::maybeChain<void>(&local_40,(Promise<void> *)&intermediate);
    pPVar1 = local_40.ptr;
    local_30.disposer = local_40.disposer;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    local_98.disposer = local_40.disposer;
    local_98.ptr = pPVar1;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_30);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    _::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
              ((NullableValue<kj::Promise<void>> *)&this->sendingPong,(Promise<void> *)&local_98);
    Own<kj::_::PromiseNode>::dispose(&local_98);
  }
  else {
    local_58.ptr = payload->ptr;
    local_58.size_ = payload->size_;
    local_58.disposer = payload->disposer;
    payload->ptr = (uchar *)0x0;
    payload->size_ = 0;
    sendPong((WebSocketImpl *)local_88,(Array<unsigned_char> *)this);
    _::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
              ((NullableValue<kj::Promise<void>> *)&this->sendingPong,(Promise<void> *)local_88);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_88);
    this_01 = &local_58;
  }
  Array<unsigned_char>::~Array(this_01);
  return;
}

Assistant:

void queuePong(kj::Array<byte> payload) {
    if (currentlySending) {
      // There is a message-send in progress, so we cannot write to the stream now.
      //
      // Note: According to spec, if the server receives a second ping before responding to the
      //   previous one, it can opt to respond only to the last ping. So we don't have to check if
      //   queuedPong is already non-null.
      queuedPong = kj::mv(payload);
    } else KJ_IF_MAYBE(promise, sendingPong) {
      // We're still sending a previous pong. Wait for it to finish before sending ours.
      sendingPong = promise->then(kj::mvCapture(payload, [this](kj::Array<byte> payload) mutable {
        return sendPong(kj::mv(payload));
      }));
    } else {
      // We're not sending any pong currently.
      sendingPong = sendPong(kj::mv(payload));
    }